

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * wasm::Literal::makeFromMemory(Literal *__return_storage_ptr__,void *p,Type type)

{
  BasicType BVar1;
  undefined8 uStack_38;
  uint8_t bytes [16];
  Type local_20;
  Type type_local;
  
  local_20.id = type.id;
  if (type.id - 2 < 5) {
    BVar1 = wasm::Type::getBasic(&local_20);
    switch(BVar1) {
    case i32:
      (__return_storage_ptr__->field_0).i32 = *p;
      (__return_storage_ptr__->type).id = 2;
      break;
    case i64:
      (__return_storage_ptr__->field_0).i64 = *p;
      (__return_storage_ptr__->type).id = 3;
      break;
    case f32:
      (__return_storage_ptr__->field_0).i32 = *p;
      (__return_storage_ptr__->type).id = 4;
      break;
    case f64:
      (__return_storage_ptr__->field_0).i64 = *p;
      (__return_storage_ptr__->type).id = 5;
      break;
    case v128:
      uStack_38 = *p;
      bytes._0_8_ = *(undefined8 *)((long)p + 8);
      Literal(__return_storage_ptr__,(uint8_t *)&uStack_38);
      break;
    default:
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                         ,0x12f);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("type.isNumber()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                ,0x113,"static Literal wasm::Literal::makeFromMemory(void *, Type)");
}

Assistant:

Literal Literal::makeFromMemory(void* p, Type type) {
  assert(type.isNumber());
  switch (type.getBasic()) {
    case Type::i32: {
      int32_t i;
      memcpy(&i, p, sizeof(i));
      return Literal(i);
    }
    case Type::i64: {
      int64_t i;
      memcpy(&i, p, sizeof(i));
      return Literal(i);
    }
    case Type::f32: {
      int32_t i;
      memcpy(&i, p, sizeof(i));
      return Literal(bit_cast<float>(i));
    }
    case Type::f64: {
      int64_t i;
      memcpy(&i, p, sizeof(i));
      return Literal(bit_cast<double>(i));
    }
    case Type::v128: {
      uint8_t bytes[16];
      memcpy(bytes, p, sizeof(bytes));
      return Literal(bytes);
    }
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}